

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def.h
# Opt level: O0

void __thiscall format::CSC::CSC(CSC *this,size_t M,size_t N,size_t NNZ,bool is_p,int st)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int *piVar5;
  double *__s;
  int st_local;
  bool is_p_local;
  size_t NNZ_local;
  size_t N_local;
  size_t M_local;
  CSC *this_local;
  
  this->m = M;
  this->n = N;
  this->nnz = NNZ;
  this->stype = st;
  this->is_pattern = is_p;
  this->p = (int *)0x0;
  this->i = (int *)0x0;
  this->x = (double *)0x0;
  this->pre_alloc = false;
  if (N == 0) {
    this->p = (int *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = N + 1;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar4);
    memset(piVar5,0,uVar4);
    this->p = piVar5;
  }
  if (NNZ == 0) {
    this->i = (int *)0x0;
    this->x = (double *)0x0;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = NNZ;
    uVar4 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar4);
    memset(piVar5,0,uVar4);
    this->i = piVar5;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = NNZ;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    __s = (double *)operator_new__(uVar4);
    memset(__s,0,uVar4);
    this->x = __s;
  }
  return;
}

Assistant:

CSC(size_t M, size_t N, size_t NNZ, bool is_p, int st) :
   m(M), n(N), nnz(NNZ), is_pattern(is_p), stype(st),
   p(NULLPNTR), i(NULLPNTR), x(NULLPNTR) {
    pre_alloc = false;
    if (N > 0)
     p = new int[N + 1]();
    else
     p = NULLPNTR;
    if (NNZ > 0) {
     i = new int[NNZ]();
     x = new double[NNZ]();
    } else {
     i = NULLPNTR;
     x = NULLPNTR;
    }
   }